

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O2

int planandnavigatexythetalat
              (PlannerType plannerType,char *envCfgFilename,char *motPrimFilename,bool forwardSearch
              )

{
  double dVar1;
  EnvNAVXYTHETALAT_InitParms EVar2;
  bool bVar3;
  ADPlanner *pAVar4;
  FILE *__stream;
  double dVar5;
  pointer piVar6;
  pointer piVar7;
  double dVar8;
  char cVar9;
  byte bVar10;
  byte bVar11;
  undefined4 uVar12;
  uint uVar13;
  anaPlanner *this;
  const_reference pvVar14;
  ostream *poVar15;
  reference pvVar16;
  undefined4 extraout_var;
  clock_t cVar17;
  clock_t cVar18;
  reference pvVar19;
  SBPL_Exception *pSVar20;
  undefined7 in_register_00000009;
  long lVar21;
  vector *pvVar22;
  int j;
  uint uVar23;
  uint uVar24;
  int iVar25;
  ulong uVar26;
  ulong uVar27;
  int y;
  int iVar28;
  uint uVar29;
  int iVar30;
  int *piVar31;
  undefined8 *puVar32;
  char *pcVar33;
  int y_1;
  int iVar34;
  int x_1;
  int iVar35;
  ulong uVar36;
  int x;
  int iVar37;
  size_type sVar38;
  undefined8 in_stack_fffffffffffff998;
  undefined8 uVar39;
  double *pdVar40;
  double *pdVar41;
  double *pdVar42;
  double *pdVar43;
  double *pdVar44;
  double *pdVar45;
  double *pdVar46;
  vector *pvVar47;
  vector<SBPL_xytheta_mprimitive,_std::allocator<SBPL_xytheta_mprimitive>_> *pvVar48;
  char *local_600;
  int newtheta;
  int newy;
  int newx;
  uchar obsthresh;
  int size_x;
  char *local_5e0;
  int size_y;
  ADPlanner *local_5d0;
  int num_thetas;
  FILE *local_5c0;
  double starty;
  double startx;
  ulong local_5a8;
  void *local_5a0;
  double cellsize_m;
  double starttheta;
  double goaltheta;
  double goaly;
  double goalx;
  uint local_570;
  uint local_56c;
  vector<sbpl_xy_theta_pt_t,_std::allocator<sbpl_xy_theta_pt_t>_> xythetaPath;
  vector<int,_std::allocator<int>_> preds_of_changededgesIDV;
  vector<int,_std::allocator<int>_> solution_stateIDs_V;
  sbpl_2Dcell_t nav2dcell;
  MDPConfig MDPCfg;
  vector<sbpl_2Dcell_t,_std::allocator<sbpl_2Dcell_t>_> changedcellsV;
  vector<sbpl_2Dcell_t,_std::allocator<sbpl_2Dcell_t>_> sensecells;
  vector<sbpl_2Dpt_t,_std::allocator<sbpl_2Dpt_t>_> perimeterptsV;
  value_type local_488;
  double timetoturn45degsinplace_secs;
  double nominalvel_mpersecs;
  vector<SBPL_xytheta_mprimitive,_std::allocator<SBPL_xytheta_mprimitive>_> motionprimitiveV;
  EnvironmentNAVXYTHETALAT environment_navxythetalat;
  EnvironmentNAVXYTHETALAT trueenvironment_navxythetalat;
  int local_88 [2];
  void *local_80;
  double local_78;
  double local_70;
  double local_68;
  double local_60;
  double local_58;
  double local_50;
  undefined8 local_48;
  undefined8 uStack_40;
  undefined8 local_38;
  
  bVar11 = 0;
  local_5c0 = (FILE *)CONCAT44(local_5c0._4_4_,(int)CONCAT71(in_register_00000009,forwardSearch));
  EnvironmentNAVXYTHETALAT::EnvironmentNAVXYTHETALAT(&environment_navxythetalat);
  EnvironmentNAVXYTHETALAT::EnvironmentNAVXYTHETALAT(&trueenvironment_navxythetalat);
  perimeterptsV.super__Vector_base<sbpl_2Dpt_t,_std::allocator<sbpl_2Dpt_t>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  perimeterptsV.super__Vector_base<sbpl_2Dpt_t,_std::allocator<sbpl_2Dpt_t>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  perimeterptsV.super__Vector_base<sbpl_2Dpt_t,_std::allocator<sbpl_2Dpt_t>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_488.x = -0.01;
  local_488.y = -0.01;
  std::vector<sbpl_2Dpt_t,_std::allocator<sbpl_2Dpt_t>_>::push_back(&perimeterptsV,&local_488);
  local_488.x = 0.01;
  local_488.y = -0.01;
  std::vector<sbpl_2Dpt_t,_std::allocator<sbpl_2Dpt_t>_>::push_back(&perimeterptsV,&local_488);
  local_488.x = 0.01;
  local_488.y = 0.01;
  std::vector<sbpl_2Dpt_t,_std::allocator<sbpl_2Dpt_t>_>::push_back(&perimeterptsV,&local_488);
  local_488.x = -0.01;
  local_488.y = 0.01;
  std::vector<sbpl_2Dpt_t,_std::allocator<sbpl_2Dpt_t>_>::push_back(&perimeterptsV,&local_488);
  cVar9 = EnvironmentNAVXYTHETALATTICE::InitializeEnv((char *)&trueenvironment_navxythetalat);
  local_5e0 = motPrimFilename;
  if (cVar9 == '\0') {
    pSVar20 = (SBPL_Exception *)__cxa_allocate_exception(0x10);
    SBPL_Exception::SBPL_Exception(pSVar20,"ERROR: InitializeEnv failed");
    __cxa_throw(pSVar20,&SBPL_Exception::typeinfo,std::runtime_error::~runtime_error);
  }
  size_x = -1;
  size_y = -1;
  num_thetas = -1;
  startx = -1.0;
  starty = -1.0;
  pdVar40 = &starttheta;
  starttheta = -1.0;
  pdVar41 = &goalx;
  goalx = -1.0;
  pdVar42 = &goaly;
  goaly = -1.0;
  pdVar43 = &goaltheta;
  goaltheta = -1.0;
  pdVar44 = &cellsize_m;
  cellsize_m = 0.0;
  pdVar45 = &nominalvel_mpersecs;
  nominalvel_mpersecs = 0.0;
  pdVar46 = &timetoturn45degsinplace_secs;
  timetoturn45degsinplace_secs = 0.0;
  pvVar47 = (vector *)&obsthresh;
  obsthresh = '\0';
  pvVar48 = &motionprimitiveV;
  motionprimitiveV.
  super__Vector_base<SBPL_xytheta_mprimitive,_std::allocator<SBPL_xytheta_mprimitive>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  motionprimitiveV.
  super__Vector_base<SBPL_xytheta_mprimitive,_std::allocator<SBPL_xytheta_mprimitive>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  motionprimitiveV.
  super__Vector_base<SBPL_xytheta_mprimitive,_std::allocator<SBPL_xytheta_mprimitive>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  uVar39 = 0x108db0;
  EnvironmentNAVXYTHETALATTICE::GetEnvParms
            ((int *)&trueenvironment_navxythetalat,&size_x,&size_y,(double *)&num_thetas,&startx,
             &starty,pdVar40,pdVar41,pdVar42,pdVar43,pdVar44,pdVar45,(uchar *)pdVar46,pvVar47);
  EnvironmentNAVXYTHETALATTICE::GetEnvParameter((char *)&trueenvironment_navxythetalat);
  uVar12 = EnvironmentNAVXYTHETALATTICE::GetEnvParameter((char *)&trueenvironment_navxythetalat);
  local_5a8 = CONCAT44(local_5a8._4_4_,uVar12);
  puts("true map:");
  for (iVar28 = 0; iVar28 < size_y; iVar28 = iVar28 + 1) {
    for (iVar37 = 0; iVar37 < size_x; iVar37 = iVar37 + 1) {
      bVar10 = EnvironmentNAVXYTHETALATTICE::GetMapCost((int)&trueenvironment_navxythetalat,iVar37);
      printf("%3d ",(ulong)bVar10);
    }
    putchar(10);
  }
  uVar13 = system("pause");
  uVar36 = 0;
  printf("System Pause (return=%d)\n",(ulong)uVar13);
  uVar26 = (long)size_y * (long)size_x;
  local_5a0 = operator_new__(uVar26);
  uVar27 = uVar26 & 0xffffffff;
  if ((int)uVar26 < 1) {
    uVar27 = uVar36;
  }
  for (; uVar27 != uVar36; uVar36 = uVar36 + 1) {
    *(undefined1 *)((long)local_5a0 + uVar36) = 0;
  }
  printf("start: %f %f %f, goal: %f %f %f\n",SUB84(startx,0),starty,starttheta,SUB84(goalx,0),goaly,
         goaltheta);
  cVar9 = EnvironmentNAVXYTHETALATTICE::SetEnvParameter((char *)&environment_navxythetalat,0x10c6df)
  ;
  if (cVar9 == '\0') {
    pSVar20 = (SBPL_Exception *)__cxa_allocate_exception(0x10);
    SBPL_Exception::SBPL_Exception(pSVar20,"ERROR: failed to set parameters");
LAB_00109d77:
    __cxa_throw(pSVar20,&SBPL_Exception::typeinfo,std::runtime_error::~runtime_error);
  }
  cVar9 = EnvironmentNAVXYTHETALATTICE::SetEnvParameter((char *)&environment_navxythetalat,0x10c6f5)
  ;
  dVar8 = nominalvel_mpersecs;
  dVar5 = timetoturn45degsinplace_secs;
  dVar1 = cellsize_m;
  iVar28 = size_x;
  if (cVar9 == '\0') {
    pSVar20 = (SBPL_Exception *)__cxa_allocate_exception(0x10);
    SBPL_Exception::SBPL_Exception(pSVar20,"ERROR: failed to set parameters");
    goto LAB_00109d77;
  }
  pvVar22 = (vector *)(ulong)(uint)size_y;
  pcVar33 = (char *)(ulong)obsthresh;
  local_88[0] = num_thetas;
  local_80 = local_5a0;
  local_78 = startx;
  local_70 = starty;
  local_68 = starttheta;
  local_60 = goalx;
  local_58 = goaly;
  local_50 = goaltheta;
  local_48 = 0x3f50624dd2f1a9fc;
  uStack_40 = 0x3f50624dd2f1a9fc;
  local_38 = 0x3f50624dd2f1a9fc;
  piVar31 = local_88;
  puVar32 = (undefined8 *)&stack0xfffffffffffff998;
  for (lVar21 = 0xb; lVar21 != 0; lVar21 = lVar21 + -1) {
    *puVar32 = *(undefined8 *)piVar31;
    piVar31 = piVar31 + ((ulong)bVar11 * -2 + 1) * 2;
    puVar32 = puVar32 + (ulong)bVar11 * -2 + 1;
  }
  EVar2.mapdata = (uchar *)uVar39;
  EVar2._0_8_ = in_stack_fffffffffffff998;
  EVar2.startx = (double)pdVar40;
  EVar2.starty = (double)pdVar41;
  EVar2.starttheta = (double)pdVar42;
  EVar2.goalx = (double)pdVar43;
  EVar2.goaly = (double)pdVar44;
  EVar2.goaltheta = (double)pdVar45;
  EVar2.goaltol_x = (double)pdVar46;
  EVar2.goaltol_y = (double)pvVar47;
  EVar2.goaltol_theta = (double)pvVar48;
  cVar9 = EnvironmentNAVXYTHETALATTICE::InitializeEnv
                    ((int)&environment_navxythetalat,iVar28,pvVar22,dVar1,dVar8,dVar5,
                     (uchar)&perimeterptsV,pcVar33,EVar2);
  if (cVar9 == '\0') {
    pSVar20 = (SBPL_Exception *)__cxa_allocate_exception(0x10);
    SBPL_Exception::SBPL_Exception(pSVar20,"ERROR: InitializeEnv failed");
    __cxa_throw(pSVar20,&SBPL_Exception::typeinfo,std::runtime_error::~runtime_error);
  }
  EnvironmentNAVXYTHETALAT::SetStart(startx,starty,starttheta);
  EnvironmentNAVXYTHETALAT::SetGoal(goalx,goaly,goaltheta);
  cVar9 = EnvironmentNAVXYTHETALATTICE::InitializeMDPCfg((MDPConfig *)&environment_navxythetalat);
  if (cVar9 == '\0') {
    pSVar20 = (SBPL_Exception *)__cxa_allocate_exception(0x10);
    SBPL_Exception::SBPL_Exception(pSVar20,"ERROR: InitializeMDPCfg failed");
    __cxa_throw(pSVar20,&SBPL_Exception::typeinfo,std::runtime_error::~runtime_error);
  }
  solution_stateIDs_V.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  solution_stateIDs_V.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  solution_stateIDs_V.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  bVar3 = local_5c0._0_1_;
  switch(plannerType) {
  case PLANNER_TYPE_ADSTAR:
    puts("Initializing ADPlanner...");
    this = (anaPlanner *)operator_new(0x98);
    ADPlanner::ADPlanner
              ((ADPlanner *)this,(DiscreteSpaceInformation *)&environment_navxythetalat,bVar3);
    break;
  case PLANNER_TYPE_ARASTAR:
    puts("Initializing ARAPlanner...");
    this = (anaPlanner *)operator_new(0xa0);
    ARAPlanner::ARAPlanner
              ((ARAPlanner *)this,(DiscreteSpaceInformation *)&environment_navxythetalat,bVar3);
    break;
  default:
    puts("Invalid planner type");
    this = (anaPlanner *)0x0;
    break;
  case PLANNER_TYPE_RSTAR:
    puts("Invalid configuration: xytheta environment does not support rstar planner...");
    iVar28 = 0;
    goto LAB_00109c4c;
  case PLANNER_TYPE_ANASTAR:
    puts("Initializing anaPlanner...");
    this = (anaPlanner *)operator_new(0x48);
    anaPlanner::anaPlanner(this,(DiscreteSpaceInformation *)&environment_navxythetalat,bVar3);
  }
  iVar28 = (**(code **)(*(long *)this + 0x28))(this,MDPCfg.startstateid);
  local_5d0 = (ADPlanner *)this;
  if (iVar28 == 0) {
    pSVar20 = (SBPL_Exception *)__cxa_allocate_exception(0x10);
    SBPL_Exception::SBPL_Exception(pSVar20,"ERROR: failed to set start state");
  }
  else {
    iVar28 = (**(code **)(*(long *)this + 0x20))(this,MDPCfg.goalstateid);
    pAVar4 = local_5d0;
    if (iVar28 != 0) {
      (**(code **)(*(long *)local_5d0 + 0x90))(0,local_5d0);
      (**(code **)(*(long *)pAVar4 + 0x40))(pAVar4,0);
      sensecells.super__Vector_base<sbpl_2Dcell_t,_std::allocator<sbpl_2Dcell_t>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      sensecells.super__Vector_base<sbpl_2Dcell_t,_std::allocator<sbpl_2Dcell_t>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      sensecells.super__Vector_base<sbpl_2Dcell_t,_std::allocator<sbpl_2Dcell_t>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      lVar21 = EnvironmentNAVXYTHETALATTICE::GetEnvNavConfig();
      local_600 = (char *)0x0;
      for (sVar38 = 0;
          (long)sVar38 < (long)(int)((*(long *)(lVar21 + 0xe0) - *(long *)(lVar21 + 0xd8)) / 0x38);
          sVar38 = sVar38 + 1) {
        pvVar14 = std::vector<SBPL_xytheta_mprimitive,_std::allocator<SBPL_xytheta_mprimitive>_>::at
                            ((vector<SBPL_xytheta_mprimitive,_std::allocator<SBPL_xytheta_mprimitive>_>
                              *)(lVar21 + 0xd8),sVar38);
        iVar28 = *(int *)&pvVar14->endcell;
        iVar37 = *(int *)&pvVar14->field_0x10;
        local_5e0 = (char *)(double)(iVar37 * iVar37 + iVar28 * iVar28);
        if ((double)local_600 < (double)local_5e0) {
          poVar15 = std::operator<<((ostream *)&std::cout,
                                    "Found a longer motion primitive with dx = ");
          poVar15 = (ostream *)std::ostream::operator<<(poVar15,iVar28);
          poVar15 = std::operator<<(poVar15," and dy = ");
          poVar15 = (ostream *)std::ostream::operator<<(poVar15,iVar37);
          poVar15 = std::operator<<(poVar15," from starttheta = ");
          poVar15 = (ostream *)std::ostream::operator<<(poVar15,(uint)pvVar14->starttheta_c);
          std::endl<char,std::char_traits<char>>(poVar15);
          local_600 = local_5e0;
        }
      }
      if ((double)local_600 < 0.0) {
        dVar1 = sqrt((double)local_600);
      }
      else {
        dVar1 = SQRT((double)local_600);
      }
      std::operator<<((ostream *)&std::cout,"Maximum motion primitive length: ");
      poVar15 = std::ostream::_M_insert<double>(dVar1);
      std::endl<char,std::char_traits<char>>(poVar15);
      dVar1 = ceil(dVar1);
      iVar37 = (int)dVar1;
      for (iVar28 = -iVar37; iVar34 = -iVar37, iVar28 <= iVar37; iVar28 = iVar28 + 1) {
        for (; iVar34 <= iVar37; iVar34 = iVar34 + 1) {
          preds_of_changededgesIDV.super__Vector_base<int,_std::allocator<int>_>._M_impl.
          super__Vector_impl_data._M_start = (pointer)CONCAT44(iVar34,iVar28);
          std::vector<sbpl_2Dcell_t,_std::allocator<sbpl_2Dcell_t>_>::emplace_back<sbpl_2Dcell_t>
                    (&sensecells,(sbpl_2Dcell_t *)&preds_of_changededgesIDV);
        }
      }
      local_5c0 = fopen("sol.txt","w");
      if (local_5c0 == (FILE *)0x0) {
        pSVar20 = (SBPL_Exception *)__cxa_allocate_exception(0x10);
        SBPL_Exception::SBPL_Exception(pSVar20,"ERROR: could not open solution file");
        __cxa_throw(pSVar20,&SBPL_Exception::typeinfo,std::runtime_error::~runtime_error);
      }
      uVar23 = (int)(goalx / cellsize_m) - (uint)(goalx < 0.0);
      uVar29 = (int)(goaly / cellsize_m) - (uint)(goaly < 0.0);
      uVar13 = ContTheta2Disc(goaltheta,num_thetas);
      printf("goal_c: %d %d %d\n",(ulong)uVar23,(ulong)uVar29,(ulong)uVar13);
      preds_of_changededgesIDV.super__Vector_base<int,_std::allocator<int>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      changedcellsV.super__Vector_base<sbpl_2Dcell_t,_std::allocator<sbpl_2Dcell_t>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      nav2dcell.x = 0;
      nav2dcell.y = 0;
      preds_of_changededgesIDV.super__Vector_base<int,_std::allocator<int>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      preds_of_changededgesIDV.super__Vector_base<int,_std::allocator<int>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      changedcellsV.super__Vector_base<sbpl_2Dcell_t,_std::allocator<sbpl_2Dcell_t>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      changedcellsV.super__Vector_base<sbpl_2Dcell_t,_std::allocator<sbpl_2Dcell_t>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      xythetaPath.super__Vector_base<sbpl_xy_theta_pt_t,_std::allocator<sbpl_xy_theta_pt_t>_>.
      _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      xythetaPath.super__Vector_base<sbpl_xy_theta_pt_t,_std::allocator<sbpl_xy_theta_pt_t>_>.
      _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      xythetaPath.super__Vector_base<sbpl_xy_theta_pt_t,_std::allocator<sbpl_xy_theta_pt_t>_>.
      _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      iVar28 = 1;
      while (((0.001 < ABS(startx - goalx) || (0.001 < ABS(starty - goaly))) ||
             (0.001 < ABS(starttheta - goaltheta)))) {
        if (preds_of_changededgesIDV.super__Vector_base<int,_std::allocator<int>_>._M_impl.
            super__Vector_impl_data._M_finish !=
            preds_of_changededgesIDV.super__Vector_base<int,_std::allocator<int>_>._M_impl.
            super__Vector_impl_data._M_start) {
          preds_of_changededgesIDV.super__Vector_base<int,_std::allocator<int>_>._M_impl.
          super__Vector_impl_data._M_finish =
               preds_of_changededgesIDV.super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start;
        }
        if (changedcellsV.super__Vector_base<sbpl_2Dcell_t,_std::allocator<sbpl_2Dcell_t>_>._M_impl.
            super__Vector_impl_data._M_finish !=
            changedcellsV.super__Vector_base<sbpl_2Dcell_t,_std::allocator<sbpl_2Dcell_t>_>._M_impl.
            super__Vector_impl_data._M_start) {
          changedcellsV.super__Vector_base<sbpl_2Dcell_t,_std::allocator<sbpl_2Dcell_t>_>._M_impl.
          super__Vector_impl_data._M_finish =
               changedcellsV.super__Vector_base<sbpl_2Dcell_t,_std::allocator<sbpl_2Dcell_t>_>.
               _M_impl.super__Vector_impl_data._M_start;
        }
        local_5a8 = 0;
        for (sVar38 = 0; dVar1 = startx,
            (long)sVar38 <
            (long)(int)((ulong)((long)sensecells.
                                      super__Vector_base<sbpl_2Dcell_t,_std::allocator<sbpl_2Dcell_t>_>
                                      ._M_impl.super__Vector_impl_data._M_finish -
                               (long)sensecells.
                                     super__Vector_base<sbpl_2Dcell_t,_std::allocator<sbpl_2Dcell_t>_>
                                     ._M_impl.super__Vector_impl_data._M_start) >> 3);
            sVar38 = sVar38 + 1) {
          local_5e0 = (char *)cellsize_m;
          pvVar16 = std::vector<sbpl_2Dcell_t,_std::allocator<sbpl_2Dcell_t>_>::at
                              (&sensecells,sVar38);
          dVar5 = starty;
          uVar13 = ((int)(dVar1 / (double)local_5e0) - (uint)(dVar1 < 0.0)) + pvVar16->x;
          local_5e0 = (char *)cellsize_m;
          pvVar16 = std::vector<sbpl_2Dcell_t,_std::allocator<sbpl_2Dcell_t>_>::at
                              (&sensecells,sVar38);
          iVar37 = size_x;
          if (((-1 < (int)uVar13) && ((int)uVar13 < size_x)) &&
             ((uVar24 = ((int)(dVar5 / (double)local_5e0) - (uint)(dVar5 < 0.0)) + pvVar16->y,
              -1 < (int)uVar24 && ((int)uVar24 < size_y)))) {
            cVar9 = EnvironmentNAVXYTHETALATTICE::GetMapCost
                              ((int)&trueenvironment_navxythetalat,uVar13);
            lVar21 = (ulong)uVar13 + (ulong)(iVar37 * uVar24);
            if (*(char *)((long)local_5a0 + lVar21) != cVar9) {
              *(char *)((long)local_5a0 + lVar21) = cVar9;
              EnvironmentNAVXYTHETALATTICE::UpdateCost
                        ((int)&environment_navxythetalat,uVar13,(uchar)uVar24);
              iVar37 = printf("setting cost[%d][%d] to %d\n",(ulong)uVar13,(ulong)uVar24);
              nav2dcell.y = uVar24;
              nav2dcell.x = uVar13;
              local_5a8 = CONCAT71((int7)(CONCAT44(extraout_var,iVar37) >> 8),1);
              std::vector<sbpl_2Dcell_t,_std::allocator<sbpl_2Dcell_t>_>::push_back
                        (&changedcellsV,&nav2dcell);
            }
          }
        }
        cVar17 = clock();
        pAVar4 = local_5d0;
        if ((local_5a8 & 1) != 0) {
          lVar21 = __dynamic_cast(local_5d0,&SBPLPlanner::typeinfo,&ARAPlanner::typeinfo,0);
          if (lVar21 == 0) {
            lVar21 = __dynamic_cast(pAVar4,&SBPLPlanner::typeinfo,&ADPlanner::typeinfo,0);
            if (lVar21 != 0) {
              EnvironmentNAVXYTHETALAT::GetPredsofChangedEdges
                        ((vector *)&environment_navxythetalat,(vector *)&changedcellsV);
              (**(code **)(*(long *)local_5d0 + 0xb0))(local_5d0,&preds_of_changededgesIDV);
              printf("%d states were affected\n",
                     (ulong)((long)preds_of_changededgesIDV.
                                   super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                   super__Vector_impl_data._M_finish -
                            (long)preds_of_changededgesIDV.
                                  super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                  super__Vector_impl_data._M_start) >> 2);
            }
          }
          else {
            (**(code **)(*(long *)pAVar4 + 0xa8))(pAVar4);
          }
        }
        local_56c = (int)(startx / cellsize_m) - (uint)(startx < 0.0);
        local_570 = (int)(starty / cellsize_m) - (uint)(starty < 0.0);
        uVar13 = ContTheta2Disc(starttheta,num_thetas);
        puts("new planning...");
        iVar37 = (*(code *)**(undefined8 **)local_5d0)(0,local_5d0,&solution_stateIDs_V);
        piVar7 = solution_stateIDs_V.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_finish;
        piVar6 = solution_stateIDs_V.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_start;
        (**(code **)(*(long *)local_5d0 + 0x50))();
        printf("done with the solution of size=%d and sol. eps=%f\n",
               (ulong)((long)piVar7 - (long)piVar6) >> 2 & 0xffffffff);
        EnvironmentNAVXYTHETALATTICE::PrintTimeStat((_IO_FILE *)&environment_navxythetalat);
        cVar18 = clock();
        uVar39 = (**(code **)(*(long *)local_5d0 + 0x50))();
        __stream = local_5c0;
        fprintf(local_5c0,"plan time=%.5f eps=%.2f\n",
                SUB84(((double)cVar18 - (double)cVar17) / 1000000.0,0),uVar39);
        fflush(__stream);
        if (xythetaPath.super__Vector_base<sbpl_xy_theta_pt_t,_std::allocator<sbpl_xy_theta_pt_t>_>.
            _M_impl.super__Vector_impl_data._M_finish !=
            xythetaPath.super__Vector_base<sbpl_xy_theta_pt_t,_std::allocator<sbpl_xy_theta_pt_t>_>.
            _M_impl.super__Vector_impl_data._M_start) {
          xythetaPath.super__Vector_base<sbpl_xy_theta_pt_t,_std::allocator<sbpl_xy_theta_pt_t>_>.
          _M_impl.super__Vector_impl_data._M_finish =
               xythetaPath.
               super__Vector_base<sbpl_xy_theta_pt_t,_std::allocator<sbpl_xy_theta_pt_t>_>._M_impl.
               super__Vector_impl_data._M_start;
        }
        EnvironmentNAVXYTHETALAT::ConvertStateIDPathintoXYThetaPath
                  ((vector *)&environment_navxythetalat,(vector *)&solution_stateIDs_V);
        printf("actual path (with intermediate poses) size=%d\n",
               ((long)xythetaPath.
                      super__Vector_base<sbpl_xy_theta_pt_t,_std::allocator<sbpl_xy_theta_pt_t>_>.
                      _M_impl.super__Vector_impl_data._M_finish -
               (long)xythetaPath.
                     super__Vector_base<sbpl_xy_theta_pt_t,_std::allocator<sbpl_xy_theta_pt_t>_>.
                     _M_impl.super__Vector_impl_data._M_start) / 0x18 & 0xffffffff,
               ((long)xythetaPath.
                      super__Vector_base<sbpl_xy_theta_pt_t,_std::allocator<sbpl_xy_theta_pt_t>_>.
                      _M_impl.super__Vector_impl_data._M_finish -
               (long)xythetaPath.
                     super__Vector_base<sbpl_xy_theta_pt_t,_std::allocator<sbpl_xy_theta_pt_t>_>.
                     _M_impl.super__Vector_impl_data._M_start) % 0x18);
        for (uVar24 = 0; uVar27 = (ulong)uVar24,
            uVar27 < (ulong)(((long)xythetaPath.
                                    super__Vector_base<sbpl_xy_theta_pt_t,_std::allocator<sbpl_xy_theta_pt_t>_>
                                    ._M_impl.super__Vector_impl_data._M_finish -
                             (long)xythetaPath.
                                   super__Vector_base<sbpl_xy_theta_pt_t,_std::allocator<sbpl_xy_theta_pt_t>_>
                                   ._M_impl.super__Vector_impl_data._M_start) / 0x18);
            uVar24 = uVar24 + 1) {
          pvVar19 = std::vector<sbpl_xy_theta_pt_t,_std::allocator<sbpl_xy_theta_pt_t>_>::at
                              (&xythetaPath,uVar27);
          uVar39 = *(undefined8 *)pvVar19;
          pvVar19 = std::vector<sbpl_xy_theta_pt_t,_std::allocator<sbpl_xy_theta_pt_t>_>::at
                              (&xythetaPath,uVar27);
          local_5e0 = *(char **)(pvVar19 + 8);
          pvVar19 = std::vector<sbpl_xy_theta_pt_t,_std::allocator<sbpl_xy_theta_pt_t>_>::at
                              (&xythetaPath,uVar27);
          fprintf(local_5c0,"%.3f %.3f %.3f\n",(int)uVar39,local_5e0,*(undefined8 *)(pvVar19 + 0x10)
                 );
        }
        fwrite("*********\n",10,1,local_5c0);
        for (lVar21 = 1;
            lVar21 < (int)((ulong)((long)solution_stateIDs_V.
                                         super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                         super__Vector_impl_data._M_finish -
                                  (long)solution_stateIDs_V.
                                        super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                        super__Vector_impl_data._M_start) >> 2); lVar21 = lVar21 + 1
            ) {
          newtheta = 0;
          EnvironmentNAVXYTHETALAT::GetCoordFromState
                    ((int)&environment_navxythetalat,
                     (int *)(ulong)(uint)solution_stateIDs_V.
                                         super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                         super__Vector_impl_data._M_start[lVar21],&newx,&newy);
          fprintf(local_5c0,"%d %d %d\n",(ulong)(uint)newx,(ulong)(uint)newy,0);
        }
        fflush(local_5c0);
        iVar34 = size_x * local_570 + local_56c;
        local_5a8 = CONCAT44(local_5a8._4_4_,size_x * uVar29 + uVar23);
        for (iVar25 = 0; iVar25 < size_y; iVar25 = iVar25 + 1) {
          for (iVar35 = 0; iVar30 = size_x, iVar35 < size_x; iVar35 = iVar35 + 1) {
            bVar11 = EnvironmentNAVXYTHETALATTICE::GetMapCost
                               ((int)&environment_navxythetalat,iVar35);
            iVar30 = iVar30 * iVar25 + iVar35;
            local_5e0 = (char *)CONCAT44(local_5e0._4_4_,(uint)bVar11);
            bVar3 = false;
            for (lVar21 = 1;
                lVar21 < (int)((ulong)((long)solution_stateIDs_V.
                                             super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                             super__Vector_impl_data._M_finish -
                                      (long)solution_stateIDs_V.
                                            super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                            super__Vector_impl_data._M_start) >> 2);
                lVar21 = lVar21 + 1) {
              newtheta = 0;
              EnvironmentNAVXYTHETALAT::GetCoordFromState
                        ((int)&environment_navxythetalat,
                         (int *)(ulong)(uint)solution_stateIDs_V.
                                             super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                             super__Vector_impl_data._M_start[lVar21],&newx,&newy);
              if (newy == iVar25 && newx == iVar35) {
                bVar3 = true;
              }
            }
            if (((iVar30 == iVar34) || (iVar30 == (int)local_5a8)) || (bVar3)) {
              if (iVar30 == iVar34) {
                pcVar33 = "  X ";
              }
              else if (iVar30 == (int)local_5a8) {
                pcVar33 = "  G ";
              }
              else if (bVar3) {
                pcVar33 = "  * ";
              }
              else {
                pcVar33 = "? ";
              }
              printf(pcVar33);
            }
            else {
              printf("%3d ",(ulong)local_5e0 & 0xffffffff);
            }
          }
          putchar(10);
        }
        if ((iVar37 == 1) &&
           (1 < (int)(((long)xythetaPath.
                             super__Vector_base<sbpl_xy_theta_pt_t,_std::allocator<sbpl_xy_theta_pt_t>_>
                             ._M_impl.super__Vector_impl_data._M_finish -
                      (long)xythetaPath.
                            super__Vector_base<sbpl_xy_theta_pt_t,_std::allocator<sbpl_xy_theta_pt_t>_>
                            ._M_impl.super__Vector_impl_data._M_start) / 0x18))) {
          EnvironmentNAVXYTHETALAT::GetCoordFromState
                    ((int)&environment_navxythetalat,
                     (int *)(ulong)(uint)solution_stateIDs_V.
                                         super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                         super__Vector_impl_data._M_start[1],&newx,&newy);
          printf("moving from %d %d %d to %d %d %d\n",(ulong)local_56c,(ulong)local_570,
                 (ulong)uVar13,(ulong)(uint)newx,(ulong)(uint)newy);
          cVar9 = EnvironmentNAVXYTHETALATTICE::IsValidConfiguration
                            ((int)&trueenvironment_navxythetalat,newx,newy);
          if (cVar9 == '\0') {
            pSVar20 = (SBPL_Exception *)__cxa_allocate_exception(0x10);
            SBPL_Exception::SBPL_Exception
                      (pSVar20,
                       "ERROR: robot is commanded to move into an invalid configuration according to true environment"
                      );
            __cxa_throw(pSVar20,&SBPL_Exception::typeinfo,std::runtime_error::~runtime_error);
          }
          startx = (double)newx * cellsize_m + cellsize_m * 0.5;
          starty = (double)newy * cellsize_m + cellsize_m * 0.5;
          starttheta = (double)DiscTheta2Cont(newtheta,num_thetas);
          uVar12 = EnvironmentNAVXYTHETALAT::SetStart(startx,starty,starttheta);
          iVar37 = (**(code **)(*(long *)local_5d0 + 0x28))(local_5d0,uVar12);
          if (iVar37 == 0) {
            pSVar20 = (SBPL_Exception *)__cxa_allocate_exception(0x10);
            SBPL_Exception::SBPL_Exception
                      (pSVar20,"ERROR: failed to update robot pose in the planner");
            __cxa_throw(pSVar20,&SBPL_Exception::typeinfo,std::runtime_error::~runtime_error);
          }
        }
        else {
          puts("No move is made");
        }
      }
      puts("goal reached!");
      fflush((FILE *)0x0);
      fclose(local_5c0);
      operator_delete__(local_5a0);
      (**(code **)(*(long *)local_5d0 + 0xa0))();
      std::_Vector_base<sbpl_xy_theta_pt_t,_std::allocator<sbpl_xy_theta_pt_t>_>::~_Vector_base
                (&xythetaPath.
                  super__Vector_base<sbpl_xy_theta_pt_t,_std::allocator<sbpl_xy_theta_pt_t>_>);
      std::_Vector_base<sbpl_2Dcell_t,_std::allocator<sbpl_2Dcell_t>_>::~_Vector_base
                (&changedcellsV.super__Vector_base<sbpl_2Dcell_t,_std::allocator<sbpl_2Dcell_t>_>);
      std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
                (&preds_of_changededgesIDV.super__Vector_base<int,_std::allocator<int>_>);
      std::_Vector_base<sbpl_2Dcell_t,_std::allocator<sbpl_2Dcell_t>_>::~_Vector_base
                (&sensecells.super__Vector_base<sbpl_2Dcell_t,_std::allocator<sbpl_2Dcell_t>_>);
LAB_00109c4c:
      std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
                (&solution_stateIDs_V.super__Vector_base<int,_std::allocator<int>_>);
      std::vector<SBPL_xytheta_mprimitive,_std::allocator<SBPL_xytheta_mprimitive>_>::~vector
                (&motionprimitiveV);
      std::_Vector_base<sbpl_2Dpt_t,_std::allocator<sbpl_2Dpt_t>_>::~_Vector_base
                (&perimeterptsV.super__Vector_base<sbpl_2Dpt_t,_std::allocator<sbpl_2Dpt_t>_>);
      EnvironmentNAVXYTHETALAT::~EnvironmentNAVXYTHETALAT(&trueenvironment_navxythetalat);
      EnvironmentNAVXYTHETALAT::~EnvironmentNAVXYTHETALAT(&environment_navxythetalat);
      return iVar28;
    }
    pSVar20 = (SBPL_Exception *)__cxa_allocate_exception(0x10);
    SBPL_Exception::SBPL_Exception(pSVar20,"ERROR: failed to set goal state");
  }
  __cxa_throw(pSVar20,&SBPL_Exception::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

int planandnavigatexythetalat(PlannerType plannerType, char* envCfgFilename, char* motPrimFilename, bool forwardSearch)
{
    double allocated_time_secs_foreachplan = 10.0; // in seconds
    double initialEpsilon = 3.0;
    bool bsearchuntilfirstsolution = false;
    bool bforwardsearch = forwardSearch;

    double goaltol_x = 0.001, goaltol_y = 0.001, goaltol_theta = 0.001;

    bool bPrint = false;
    bool bPrintMap = true;

    EnvironmentNAVXYTHETALAT environment_navxythetalat;
    EnvironmentNAVXYTHETALAT trueenvironment_navxythetalat;

    // set the perimeter of the robot
    // it is given with 0, 0, 0 robot ref. point for which planning is done.
    vector<sbpl_2Dpt_t> perimeterptsV;
    sbpl_2Dpt_t pt_m;
    double halfwidth = 0.01;
    double halflength = 0.01;
    pt_m.x = -halflength;
    pt_m.y = -halfwidth;
    perimeterptsV.push_back(pt_m);
    pt_m.x = halflength;
    pt_m.y = -halfwidth;
    perimeterptsV.push_back(pt_m);
    pt_m.x = halflength;
    pt_m.y = halfwidth;
    perimeterptsV.push_back(pt_m);
    pt_m.x = -halflength;
    pt_m.y = halfwidth;
    perimeterptsV.push_back(pt_m);

    //	perimeterptsV.clear();

    // initialize true map from the environment file without perimeter or motion primitives
    if (!trueenvironment_navxythetalat.InitializeEnv(envCfgFilename)) {
        throw SBPL_Exception("ERROR: InitializeEnv failed");
    }

    // environment parameters
    int size_x = -1, size_y = -1, num_thetas = -1;
    double startx = -1, starty = -1, starttheta = -1;
    double goalx = -1, goaly = -1, goaltheta = -1;
    double cellsize_m = 0.0, nominalvel_mpersecs = 0.0, timetoturn45degsinplace_secs = 0.0;
    unsigned char obsthresh = 0;
    vector<SBPL_xytheta_mprimitive> motionprimitiveV;

    // additional environment parameters
    unsigned char costinscribed_thresh = 0;
    unsigned char costcircum_thresh = 0;

    // get environment parameters from the true environment
    trueenvironment_navxythetalat.GetEnvParms(&size_x, &size_y, &num_thetas, &startx, &starty, &starttheta, &goalx,
                                              &goaly, &goaltheta, &cellsize_m, &nominalvel_mpersecs,
                                              &timetoturn45degsinplace_secs, &obsthresh, &motionprimitiveV);
    costinscribed_thresh = trueenvironment_navxythetalat.GetEnvParameter("cost_inscribed_thresh");
    costcircum_thresh = trueenvironment_navxythetalat.GetEnvParameter("cost_possibly_circumscribed_thresh");

    // print the map
    if (bPrintMap) {
        printf("true map:\n");
        for (int y = 0; y < size_y; y++) {
            for (int x = 0; x < size_x; x++) {
                printf("%3d ", trueenvironment_navxythetalat.GetMapCost(x, y));
            }
            printf("\n");
        }
        printf("System Pause (return=%d)\n", system("pause"));
    }

    // create an empty map
    unsigned char* map = new unsigned char[size_x * size_y];
    for (int i = 0; i < size_x * size_y; i++) {
        map[i] = 0;
    }

    // check the start and goal obtained from the true environment
    printf("start: %f %f %f, goal: %f %f %f\n", startx, starty, starttheta, goalx, goaly, goaltheta);

    // set robot environment parameters (should be done before initialize function is called)
    if (!environment_navxythetalat.SetEnvParameter("cost_inscribed_thresh", costinscribed_thresh)) {
        throw SBPL_Exception("ERROR: failed to set parameters");
    }
    if (!environment_navxythetalat.SetEnvParameter("cost_possibly_circumscribed_thresh", costcircum_thresh)) {
        throw SBPL_Exception("ERROR: failed to set parameters");
    }

    // initialize environment (should be called before initializing anything else)
    EnvNAVXYTHETALAT_InitParms params;
    params.startx = startx;
    params.starty = starty;
    params.starttheta = starttheta;
    params.goalx = goalx;
    params.goaly = goaly;
    params.goaltheta = goaltheta;
    params.goaltol_x = goaltol_x;
    params.goaltol_y = goaltol_y;
    params.goaltol_theta = goaltol_theta;
    params.mapdata = map;
    params.numThetas = num_thetas;

    bool envInitialized = environment_navxythetalat.InitializeEnv(size_x, size_y, perimeterptsV, cellsize_m,
                                                                  nominalvel_mpersecs, timetoturn45degsinplace_secs,
                                                                  obsthresh, motPrimFilename, params);

    if (!envInitialized) {
        throw SBPL_Exception("ERROR: InitializeEnv failed");
    }

    // set start and goal states
    environment_navxythetalat.SetStart(startx, starty, starttheta);
    environment_navxythetalat.SetGoal(goalx, goaly, goaltheta);

    MDPConfig MDPCfg;

    // initialize MDP info
    if (!environment_navxythetalat.InitializeMDPCfg(&MDPCfg)) {
        throw SBPL_Exception("ERROR: InitializeMDPCfg failed");
    }

    // create a planner
    vector<int> solution_stateIDs_V;

    SBPLPlanner* planner = NULL;
    switch (plannerType) {
    case PLANNER_TYPE_ARASTAR:
        printf("Initializing ARAPlanner...\n");
        planner = new ARAPlanner(&environment_navxythetalat, bforwardsearch);
        break;
    case PLANNER_TYPE_ADSTAR:
        printf("Initializing ADPlanner...\n");
        planner = new ADPlanner(&environment_navxythetalat, bforwardsearch);
        break;
    case PLANNER_TYPE_RSTAR:
        printf("Invalid configuration: xytheta environment does not support rstar planner...\n");
        return 0;
    case PLANNER_TYPE_ANASTAR:
        printf("Initializing anaPlanner...\n");
        planner = new anaPlanner(&environment_navxythetalat, bforwardsearch);
        break;
    default:
        printf("Invalid planner type\n");
        break;
    }

    // set the start and goal states for the planner and other search variables
    if (planner->set_start(MDPCfg.startstateid) == 0) {
        throw SBPL_Exception("ERROR: failed to set start state");
    }
    if (planner->set_goal(MDPCfg.goalstateid) == 0) {
        throw SBPL_Exception("ERROR: failed to set goal state");
    }
    planner->set_initialsolution_eps(initialEpsilon);
    planner->set_search_mode(bsearchuntilfirstsolution);

    // compute sensing as a square surrounding the robot with length twice that of the
    // longest motion primitive
    vector<sbpl_2Dcell_t> sensecells;
    double maxMotPrimLengthSquared = 0.0;
    double maxMotPrimLength = 0.0;
    const EnvNAVXYTHETALATConfig_t* cfg = environment_navxythetalat.GetEnvNavConfig();
    for (int i = 0; i < (int)cfg->mprimV.size(); i++) {
        const SBPL_xytheta_mprimitive& mprim = cfg->mprimV.at(i);
        int dx = mprim.endcell.x;
        int dy = mprim.endcell.y;
        if (dx * dx + dy * dy > maxMotPrimLengthSquared) {
            std::cout << "Found a longer motion primitive with dx = " << dx << " and dy = " << dy
                << " from starttheta = " << (int)mprim.starttheta_c << std::endl;
            maxMotPrimLengthSquared = dx * dx + dy * dy;
        }
    }
    maxMotPrimLength = sqrt((double)maxMotPrimLengthSquared);
    std::cout << "Maximum motion primitive length: " << maxMotPrimLength << std::endl;

    int sensingRange = (int)ceil(maxMotPrimLength);
    for (int x = -sensingRange; x <= sensingRange; x++) {
        for (int y = -sensingRange; y <= sensingRange; y++) {
            sensecells.push_back(sbpl_2Dcell_t(x, y));
        }
    }

    // create a file to hold the solution vector
    const char* sol = "sol.txt";
    FILE* fSol = fopen(sol, "w");
    if (fSol == NULL) {
        throw SBPL_Exception("ERROR: could not open solution file");
    }

    // print the goal pose
    int goalx_c = CONTXY2DISC(goalx, cellsize_m);
    int goaly_c = CONTXY2DISC(goaly, cellsize_m);
    int goaltheta_c = ContTheta2Disc(goaltheta, num_thetas);
    printf("goal_c: %d %d %d\n", goalx_c, goaly_c, goaltheta_c);

    vector<int> preds_of_changededgesIDV;
    vector<nav2dcell_t> changedcellsV;
    nav2dcell_t nav2dcell;
    vector<sbpl_xy_theta_pt_t> xythetaPath;

    // now comes the main loop
    while (fabs(startx - goalx) > goaltol_x || fabs(starty - goaly) > goaltol_y || fabs(starttheta - goaltheta)
        > goaltol_theta) {
        //simulate sensor data update
        bool bChanges = false;
        preds_of_changededgesIDV.clear();
        changedcellsV.clear();

        // simulate sensing the cells
        for (int i = 0; i < (int)sensecells.size(); i++) {
            int x = CONTXY2DISC(startx, cellsize_m) + sensecells.at(i).x;
            int y = CONTXY2DISC(starty, cellsize_m) + sensecells.at(i).y;

            // ignore if outside the map
            if (x < 0 || x >= size_x || y < 0 || y >= size_y) {
                continue;
            }

            int index = x + y * size_x;
            unsigned char truecost = trueenvironment_navxythetalat.GetMapCost(x, y);
            // update the cell if we haven't seen it before
            if (map[index] != truecost) {
                map[index] = truecost;
                environment_navxythetalat.UpdateCost(x, y, map[index]);
                printf("setting cost[%d][%d] to %d\n", x, y, map[index]);
                bChanges = true;
                // store the changed cells
                nav2dcell.x = x;
                nav2dcell.y = y;
                changedcellsV.push_back(nav2dcell);
            }
        }

        double TimeStarted = clock();

        // if necessary notify the planner of changes to costmap
        if (bChanges) {
            if (dynamic_cast<ARAPlanner*> (planner) != NULL) {
                ((ARAPlanner*)planner)->costs_changed(); //use by ARA* planner (non-incremental)
            }
            else if (dynamic_cast<ADPlanner*> (planner) != NULL) {
                // get the affected states
                environment_navxythetalat.GetPredsofChangedEdges(&changedcellsV, &preds_of_changededgesIDV);
                // let know the incremental planner about them
                //use by AD* planner (incremental)
                ((ADPlanner*)planner)->update_preds_of_changededges(&preds_of_changededgesIDV);
                printf("%d states were affected\n", (int)preds_of_changededgesIDV.size());
            }
        }

        int startx_c = CONTXY2DISC(startx, cellsize_m);
        int starty_c = CONTXY2DISC(starty, cellsize_m);
        int starttheta_c = ContTheta2Disc(starttheta, num_thetas);

        // plan a path
        bool bPlanExists = false;

        printf("new planning...\n");
        bPlanExists = (planner->replan(allocated_time_secs_foreachplan, &solution_stateIDs_V) == 1);
        printf("done with the solution of size=%d and sol. eps=%f\n", (unsigned int)solution_stateIDs_V.size(),
               planner->get_solution_eps());
        environment_navxythetalat.PrintTimeStat(stdout);

        // write the solution to sol.txt
        fprintf(fSol, "plan time=%.5f eps=%.2f\n", (clock() - TimeStarted) / ((double)CLOCKS_PER_SEC),
                planner->get_solution_eps());
        fflush(fSol);

        xythetaPath.clear();
        environment_navxythetalat.ConvertStateIDPathintoXYThetaPath(&solution_stateIDs_V, &xythetaPath);
        printf("actual path (with intermediate poses) size=%d\n", (unsigned int)xythetaPath.size());
        for (unsigned int i = 0; i < xythetaPath.size(); i++) {
            fprintf(fSol, "%.3f %.3f %.3f\n", xythetaPath.at(i).x, xythetaPath.at(i).y, xythetaPath.at(i).theta);
        }
        fprintf(fSol, "*********\n");

        for (int j = 1; j < (int)solution_stateIDs_V.size(); j++) {
            int newx, newy, newtheta = 0;
            environment_navxythetalat.GetCoordFromState(solution_stateIDs_V[j], newx, newy, newtheta);
            fprintf(fSol, "%d %d %d\n", newx, newy, newtheta);
        }
        fflush(fSol);

        // print the map (robot's view of the world and current plan)
        int startindex = startx_c + starty_c * size_x;
        int goalindex = goalx_c + goaly_c * size_x;
        for (int y = 0; bPrintMap && y < size_y; y++) {
            for (int x = 0; x < size_x; x++) {
                int index = x + y * size_x;
                int cost = map[index];
                cost = environment_navxythetalat.GetMapCost(x, y);

                // check to see if it is on the path
                bool bOnthePath = false;
                for (int j = 1; j < (int)solution_stateIDs_V.size(); j++) {
                    int newx, newy, newtheta = 0;
                    environment_navxythetalat.GetCoordFromState(solution_stateIDs_V[j], newx, newy, newtheta);
                    if (x == newx && y == newy) bOnthePath = true;
                }

                if (index != startindex && index != goalindex && !bOnthePath) {
                    printf("%3d ", cost);
                }
                else if (index == startindex) {
                    printf("  X ");
                }
                else if (index == goalindex) {
                    printf("  G ");
                }
                else if (bOnthePath) {
                    printf("  * ");
                }
                else {
                    printf("? ");
                }
            }
            printf("\n");
        }

        // move along the path
        if (bPlanExists && (int)xythetaPath.size() > 1) {
            //get coord of the successor
            int newx, newy, newtheta;

            // move until we move into the end of motion primitive
            environment_navxythetalat.GetCoordFromState(solution_stateIDs_V[1], newx, newy, newtheta);

            printf("moving from %d %d %d to %d %d %d\n", startx_c, starty_c, starttheta_c, newx, newy, newtheta);

            // this check is weak since true configuration does not know the actual perimeter of the robot
            if (!trueenvironment_navxythetalat.IsValidConfiguration(newx, newy, newtheta)) {
                throw SBPL_Exception("ERROR: robot is commanded to move into an invalid configuration according to true environment");
            }

            // move
            startx = DISCXY2CONT(newx, cellsize_m);
            starty = DISCXY2CONT(newy, cellsize_m);
            starttheta = DiscTheta2Cont(newtheta, num_thetas);

            // update the environment
            int newstartstateID = environment_navxythetalat.SetStart(startx, starty, starttheta);

            // update the planner
            if (planner->set_start(newstartstateID) == 0) {
                throw SBPL_Exception("ERROR: failed to update robot pose in the planner");
            }
        }
        else {
            printf("No move is made\n");
        }

        if (bPrint) {
            printf("System Pause (return=%d)\n", system("pause"));
        }
    }

    printf("goal reached!\n");

    fflush(NULL);
    fclose(fSol);

    delete[] map;
    delete planner;

    return 1;
}